

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinLaplace_bnd.c
# Opt level: O3

int func(N_Vector u,N_Vector f,void *user_data)

{
  double dVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  lVar2 = N_VGetArrayPointer();
  lVar3 = N_VGetArrayPointer(f);
  lVar4 = 1;
  do {
    lVar5 = 0;
    do {
      dVar6 = 0.0;
      if (lVar4 == 1) {
LAB_00101771:
        dVar7 = *(double *)(lVar2 + 8 + lVar5);
      }
      else {
        dVar6 = *(double *)(lVar2 + -8 + lVar5);
        dVar7 = 0.0;
        if (lVar4 != 0x1f) goto LAB_00101771;
      }
      if (lVar5 == 0) {
        dVar8 = 0.0;
LAB_00101798:
        dVar9 = *(double *)(lVar2 + 0xf8 + lVar5);
      }
      else {
        dVar8 = *(double *)(lVar2 + -0xf8 + lVar5);
        dVar9 = 0.0;
        if (lVar5 != 0x1d10) goto LAB_00101798;
      }
      dVar1 = *(double *)(lVar2 + lVar5);
      *(double *)(lVar3 + lVar5) =
           ((((dVar8 - (dVar1 + dVar1)) + dVar9) * 1024.0 +
             ((dVar7 - (dVar1 + dVar1)) + dVar6) * 1024.0 + dVar1) - dVar1 * dVar1 * dVar1) + 2.0;
      lVar5 = lVar5 + 0xf8;
    } while (lVar5 != 0x1e08);
    lVar4 = lVar4 + 1;
    lVar2 = lVar2 + 8;
    lVar3 = lVar3 + 8;
    if (lVar4 == 0x20) {
      return 0;
    }
  } while( true );
}

Assistant:

static int func(N_Vector u, N_Vector f, void* user_data)
{
  sunrealtype dx, dy, hdiff, vdiff;
  sunrealtype hdc, vdc;
  sunrealtype uij, udn, uup, ult, urt;
  sunrealtype *udata, *fdata;

  int i, j;

  dx  = ONE / (NX + 1);
  dy  = ONE / (NY + 1);
  hdc = ONE / (dx * dx);
  vdc = ONE / (dy * dy);

  udata = N_VGetArrayPointer(u);
  fdata = N_VGetArrayPointer(f);

  for (j = 1; j <= NY; j++)
  {
    for (i = 1; i <= NX; i++)
    {
      /* Extract u at x_i, y_j and four neighboring points */

      uij = IJth(udata, i, j);
      udn = (j == 1) ? ZERO : IJth(udata, i, j - 1);
      uup = (j == NY) ? ZERO : IJth(udata, i, j + 1);
      ult = (i == 1) ? ZERO : IJth(udata, i - 1, j);
      urt = (i == NX) ? ZERO : IJth(udata, i + 1, j);

      /* Evaluate diffusion components */

      hdiff = hdc * (ult - TWO * uij + urt);
      vdiff = vdc * (uup - TWO * uij + udn);

      /* Set residual at x_i, y_j */

      IJth(fdata, i, j) = hdiff + vdiff + uij - uij * uij * uij + 2.0;
    }
  }

  return (0);
}